

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat2wasm.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  void *start;
  _Alloc_hider _Var1;
  char *pcVar2;
  bool bVar3;
  Result RVar4;
  wabt *pwVar5;
  size_t sVar6;
  Callback *callback;
  char *extraout_RDX;
  uint uVar7;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view sVar8;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  Errors *in_stack_fffffffffffffea0;
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  undefined8 data;
  code *pcVar9;
  code *pcVar10;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  Errors errors;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  OptionParser parser;
  string_view local_58;
  WastParseOptions parse_wast_options;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&parser,"wat2wasm",
             "  read a file in the wasm text format, check it for errors, and\n  convert it to the wasm binary format.\n\nexamples:\n  # parse test.wat and write to .wasm binary file with the same name\n  $ wat2wasm test.wat\n\n  # parse test.wat and write to binary file test.wasm\n  $ wat2wasm test.wat -o test.wasm\n\n  # parse spec-test.wast, and write verbose output to stdout (including\n  # the meaning of every byte)\n  $ wat2wasm spec-test.wast -v\n"
            );
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:70:72)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:75:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"debug-parser","Turn on debugging the parser of wat files",
             (NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:78:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'d',"dump-module","Print a hexdump of the module to stdout",
             (NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  wabt::Features::AddOptions(&s_features,&parser);
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar9 = std::
           _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:82:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'o',"output","FILE","Output wasm binary file. Use \"-\" to write to stdout.",
             (Callback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:86:7)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'r',"relocatable",
             "Create a relocatable wasm binary (suitable for linking with e.g. lld)",
             (NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:90:7)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-canonicalize-leb128s",
             "Write all LEB128 sizes as 5-bytes instead of their minimal size",
             (NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:93:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"debug-names","Write debug names to the generated binary file",
             (NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  data = (void *)0x0;
  pcVar10 = std::
            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:95:20)>
            ::_M_invoke;
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:95:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-check","Don\'t check for invalid modules",(NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&line_finder,"filename",(allocator<char> *)&errors);
  callback = (Callback *)&file_data;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:97:22)>
                ::_M_manager;
  wabt::OptionParser::AddArgument(&parser,(string *)&line_finder,One,callback);
  if (file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&file_data,&file_data,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  pcVar2 = s_infile;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pwVar5 = (wabt *)strlen(s_infile);
  filename._M_str = (char *)&file_data;
  filename._M_len = (size_t)pcVar2;
  RVar4 = wabt::ReadFile(pwVar5,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  strlen(s_infile);
  sVar8._M_str = (char *)pcVar10;
  sVar8._M_len = (size_t)pcVar9;
  wabt::WastLexer::CreateBufferLexer
            (sVar8,(void *)data,
             (size_t)line_finder._M_t.
                     super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,
             in_stack_fffffffffffffea0);
  if (RVar4.enum_ == Error) {
    fprintf(_stderr,"unable to read file: %s\n",s_infile);
    exit(1);
  }
  module._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
       (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0;
  parse_wast_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
  parse_wast_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
  parse_wast_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
  parse_wast_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
  parse_wast_options.features.simd_enabled_ = s_features.simd_enabled_;
  parse_wast_options.features.threads_enabled_ = s_features.threads_enabled_;
  parse_wast_options.features.function_references_enabled_ = s_features.function_references_enabled_
  ;
  parse_wast_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
  parse_wast_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
  parse_wast_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
  parse_wast_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
  parse_wast_options.features.annotations_enabled_ = s_features.annotations_enabled_;
  parse_wast_options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
  parse_wast_options.features.gc_enabled_ = s_features.gc_enabled_;
  parse_wast_options.features.memory64_enabled_ = s_features.memory64_enabled_;
  parse_wast_options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
  parse_wast_options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
  parse_wast_options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
  parse_wast_options.features.custom_page_sizes_enabled_ = s_features.custom_page_sizes_enabled_;
  parse_wast_options.debug_parsing = false;
  parse_wast_options.parse_binary_modules = true;
  RVar4 = wabt::ParseWatModule
                    ((WastLexer *)
                     lexer._M_t.
                     super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                     .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&module,&errors,
                     &parse_wast_options);
  uVar7 = 1;
  if (RVar4.enum_ == Ok) {
    if (s_validate == '\0') {
      parser.program_name_.field_2._M_local_buf[0] = s_features.extended_const_enabled_;
      parser.program_name_.field_2._M_allocated_capacity._1_2_ = s_features._17_2_;
      parser.program_name_._M_dataplus._M_p = (pointer)s_features._0_8_;
      parser.program_name_._M_string_length._0_1_ = s_features.tail_call_enabled_;
      parser.program_name_._M_string_length._1_1_ = s_features.bulk_memory_enabled_;
      parser.program_name_._M_string_length._2_1_ = s_features.reference_types_enabled_;
      parser.program_name_._M_string_length._3_1_ = s_features.annotations_enabled_;
      parser.program_name_._M_string_length._4_1_ = s_features.code_metadata_enabled_;
      parser.program_name_._M_string_length._5_1_ = s_features.gc_enabled_;
      parser.program_name_._M_string_length._6_1_ = s_features.memory64_enabled_;
      parser.program_name_._M_string_length._7_1_ = s_features.multi_memory_enabled_;
      RVar4 = wabt::ValidateModule
                        ((Module *)
                         module._M_t.
                         super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,&errors,
                         (ValidateOptions *)&parser);
      if (RVar4.enum_ != Ok) goto LAB_00115c10;
    }
    wabt::MemoryStream::MemoryStream
              ((MemoryStream *)&parser,
               (Stream *)
               s_log_stream._M_t.
               super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
               super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
               super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.function_references_enabled_ =
         s_features.function_references_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    s_write_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
    s_write_binary_options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    s_write_binary_options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    s_write_binary_options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    s_write_binary_options.features.custom_page_sizes_enabled_ =
         s_features.custom_page_sizes_enabled_;
    RVar4 = wabt::WriteBinaryModule
                      ((Stream *)&parser,
                       (Module *)
                       module._M_t.
                       super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                       super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,
                       &s_write_binary_options);
    pcVar2 = s_infile;
    if (RVar4.enum_ == Ok) {
      if (s_outfile_abi_cxx11_._M_string_length == 0) {
        pwVar5 = (wabt *)strlen(s_infile);
        filename_00._M_str = extraout_RDX;
        filename_00._M_len = (size_t)pcVar2;
        sVar8 = wabt::GetBasename(pwVar5,filename_00);
        filename_01._M_str = sVar8._M_str;
        filename_01._M_len = (size_t)filename_01._M_str;
        local_58 = wabt::StripExtension((wabt *)sVar8._M_len,filename_01);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&line_finder,&local_58,(allocator<char> *)&stack0xfffffffffffffea7);
        std::__cxx11::string::append((char *)&line_finder);
        std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,(string *)&line_finder);
        std::__cxx11::string::_M_dispose();
      }
      _Var1._M_p = s_outfile_abi_cxx11_._M_dataplus._M_p;
      sVar6 = strlen(s_outfile_abi_cxx11_._M_dataplus._M_p);
      if (s_dump_module == '\x01') {
        wabt::FileStream::CreateStdout();
        if (s_verbose != 0) {
          wabt::Stream::Writef
                    ((Stream *)
                     line_finder._M_t.
                     super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,
                     ";; dump\n");
        }
        start = *(void **)parser.description_._M_dataplus._M_p;
        if (start != *(void **)(parser.description_._M_dataplus._M_p + 8)) {
          wabt::Stream::WriteMemoryDump
                    ((Stream *)
                     line_finder._M_t.
                     super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,start
                     ,(long)*(void **)(parser.description_._M_dataplus._M_p + 8) - (long)start,0,No,
                     (char *)0x0,(char *)0x0);
        }
        if ((__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
             )line_finder._M_t.
              super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
              ._M_t.
              super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
              .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
             )0x0) {
          (**(code **)(*(long *)line_finder._M_t.
                                super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                                .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>.
                                _M_head_impl + 8))();
        }
      }
      __x._M_str = _Var1._M_p;
      __x._M_len = sVar6;
      __y._M_str = "-";
      __y._M_len = 1;
      bVar3 = std::operator==(__x,__y);
      if (bVar3) {
        wabt::OutputBuffer::WriteToStdout((OutputBuffer *)parser.description_._M_dataplus._M_p);
      }
      else {
        filename_02._M_str = _Var1._M_p;
        filename_02._M_len = sVar6;
        wabt::OutputBuffer::WriteToFile
                  ((OutputBuffer *)parser.description_._M_dataplus._M_p,filename_02);
      }
    }
    wabt::MemoryStream::~MemoryStream((MemoryStream *)&parser);
    uVar7 = (uint)(RVar4.enum_ != Ok);
  }
LAB_00115c10:
  wabt::WastLexer::MakeLineFinder((WastLexer *)&line_finder);
  parser.program_name_._M_dataplus._M_p = (pointer)&parser.program_name_.field_2;
  parser.program_name_._M_string_length._0_7_ = 0;
  parser.program_name_._M_string_length._7_1_ = 0;
  parser.program_name_.field_2._M_local_buf[0] = '\0';
  wabt::FormatErrorsToFile
            (&errors,Text,
             (LexerSourceLineFinder *)
             line_finder._M_t.
             super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
             .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,
             (FILE *)_stderr,&parser.program_name_,Never,0x50);
  std::__cxx11::string::_M_dispose();
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr(&line_finder);
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr(&module);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&lexer);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar7;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  Errors errors;
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size(), &errors);
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  std::unique_ptr<Module> module;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWatModule(lexer.get(), &module, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateModule(module.get(), &errors, options);
  }

  if (Succeeded(result)) {
    MemoryStream stream(s_log_stream.get());
    s_write_binary_options.features = s_features;
    result = WriteBinaryModule(&stream, module.get(), s_write_binary_options);

    if (Succeeded(result)) {
      if (s_outfile.empty()) {
        s_outfile = DefaultOuputName(s_infile);
      }
      WriteBufferToFile(s_outfile.c_str(), stream.output_buffer());
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}